

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

uint sockaddr_get_port(sockaddr *sa)

{
  uint16_t uVar1;
  sockaddr_in *sa4;
  sockaddr_in6 *sa6;
  sockaddr *sa_local;
  
  if (sa->sa_family == 10) {
    uVar1 = ntohs(*(uint16_t *)sa->sa_data);
    sa_local._4_4_ = (uint)uVar1;
  }
  else if (sa->sa_family == 2) {
    uVar1 = ntohs(*(uint16_t *)sa->sa_data);
    sa_local._4_4_ = (uint)uVar1;
  }
  else {
    sa_local._4_4_ = 0;
  }
  return sa_local._4_4_;
}

Assistant:

unsigned int sockaddr_get_port(const struct sockaddr *sa)
{
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        return ntohs(sa6->sin6_port);
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        return ntohs(sa4->sin_port);
    }
    else
        return 0;
}